

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall
cmCacheManager::AddCacheEntry
          (cmCacheManager *this,string *key,cmValue value,cmValue helpString,CacheEntryType type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  mapped_type *this_00;
  long lVar3;
  string *i;
  _Alloc_hider path;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmList paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::operator[](&this->Cache,key);
  if (value.Value == (string *)0x0) {
    (this_00->Value)._M_string_length = 0;
    *(this_00->Value)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::_M_assign((string *)this_00);
    this_00->Initialized = true;
  }
  this_00->Type = type;
  if (type - PATH < 2) {
    lVar3 = std::__cxx11::string::find((char)this_00,0x3b);
    if (lVar3 == -1) {
      cmsys::SystemTools::ConvertToUnixSlashes(&this_00->Value);
    }
    else {
      paVar1 = &local_70.field_2;
      pcVar2 = (this_00->Value)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (this_00->Value)._M_string_length);
      init._M_len = 1;
      init._M_array = &local_70;
      cmList::cmList((cmList *)&local_50,init);
      path._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        path._M_p = local_50._M_dataplus._M_p;
      }
      for (; path._M_p != (pointer)local_50._M_string_length;
          path._M_p = (pointer)((long)path._M_p + 0x20)) {
        cmsys::SystemTools::ConvertToUnixSlashes((string *)path._M_p);
      }
      cmList::to_string_abi_cxx11_(&local_70,(cmList *)&local_50);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_50);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"HELPSTRING","");
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (helpString.Value == (string *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"(This variable does not exist and should not be used)","");
  }
  else {
    pcVar2 = ((helpString.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (helpString.Value)->_M_string_length);
  }
  CacheEntry::SetProperty(this_00,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCacheManager::AddCacheEntry(const std::string& key, cmValue value,
                                   cmValue helpString,
                                   cmStateEnums::CacheEntryType type)
{
  CacheEntry& e = this->Cache[key];
  e.SetValue(value);
  e.Type = type;
  // make sure we only use unix style paths
  if (type == cmStateEnums::FILEPATH || type == cmStateEnums::PATH) {
    if (e.Value.find(';') != std::string::npos) {
      cmList paths{ e.Value };
      for (std::string& i : paths) {
        cmSystemTools::ConvertToUnixSlashes(i);
      }
      e.Value = paths.to_string();
    } else {
      cmSystemTools::ConvertToUnixSlashes(e.Value);
    }
  }
  e.SetProperty(
    "HELPSTRING",
    helpString ? *helpString
               : std::string{
                   "(This variable does not exist and should not be used)" });
}